

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O0

bool __thiscall
node::BlockAssembler::TestPackage
          (BlockAssembler *this,uint64_t packageSize,int64_t packageSigOpsCost)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 local_9;
  
  if ((ulong)(*(long *)(in_RDI + 8) + in_RSI * 4) < *(ulong *)(in_RDI + 0xb0)) {
    if ((ulong)(*(long *)(in_RDI + 0x18) + in_RDX) < 80000) {
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockAssembler::TestPackage(uint64_t packageSize, int64_t packageSigOpsCost) const
{
    // TODO: switch to weight-based accounting for packages instead of vsize-based accounting.
    if (nBlockWeight + WITNESS_SCALE_FACTOR * packageSize >= m_options.nBlockMaxWeight) {
        return false;
    }
    if (nBlockSigOpsCost + packageSigOpsCost >= MAX_BLOCK_SIGOPS_COST) {
        return false;
    }
    return true;
}